

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemory
          (BinaryReader *this,Limits *out_page_limits,uint32_t *out_page_size)

{
  bool bVar1;
  Result result;
  uint local_68;
  Enum local_64;
  uint32_t page_size_log2;
  Enum local_5c;
  uint32_t max32;
  Enum local_54;
  uint32_t initial32;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  Result RStack_44;
  uint8_t unknown_flags;
  bool has_custom_page_size;
  bool is_64;
  bool is_shared;
  bool has_max;
  uint64_t max;
  uint64_t initial;
  uint32_t *puStack_28;
  uint8_t flags;
  uint32_t *out_page_size_local;
  Limits *out_page_limits_local;
  BinaryReader *this_local;
  
  _has_custom_page_size = 0;
  puStack_28 = out_page_size;
  out_page_size_local = (uint32_t *)out_page_limits;
  out_page_limits_local = (Limits *)this;
  RStack_44 = ReadU8(this,(uint8_t *)((long)&initial + 7),"memory flags");
  bVar1 = Failed(RStack_44);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_45 = (initial._7_1_ & 1) != 0;
    local_46 = (initial._7_1_ & 2) != 0;
    local_47 = (initial._7_1_ & 4) != 0;
    local_48 = (initial._7_1_ & 8) != 0;
    local_49 = initial._7_1_ & 0xf0;
    if (local_49 == 0) {
      if ((!(bool)local_46) || (bVar1 = Features::threads_enabled(&this->options_->features), bVar1)
         ) {
        if (((local_47 & 1) == 0) ||
           (bVar1 = Features::memory64_enabled(&this->options_->features), bVar1)) {
          if (((local_48 & 1) == 0) ||
             (bVar1 = Features::custom_page_sizes_enabled(&this->options_->features), bVar1)) {
            bVar1 = Features::memory64_enabled(&this->options_->features);
            if (bVar1) {
              initial32 = (uint32_t)ReadU64Leb128(this,&max,"memory initial page count");
              bVar1 = Failed((Result)initial32);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              if ((local_45 & 1) != 0) {
                local_54 = (Enum)ReadU64Leb128(this,(uint64_t *)&has_custom_page_size,
                                               "memory max page count");
                bVar1 = Failed((Result)local_54);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
              }
            }
            else {
              local_5c = (Enum)ReadU32Leb128(this,&max32,"memory initial page count");
              bVar1 = Failed((Result)local_5c);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              max = (uint64_t)max32;
              if ((local_45 & 1) != 0) {
                local_64 = (Enum)ReadU32Leb128(this,&page_size_log2,"memory max page count");
                bVar1 = Failed((Result)local_64);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
                _has_custom_page_size = (ulong)page_size_log2;
              }
            }
            if ((local_48 & 1) == 0) {
              *puStack_28 = 0x10000;
            }
            else {
              result = ReadU32Leb128(this,&local_68,"memory page size");
              bVar1 = Failed(result);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              if (0x10 < local_68) {
                PrintError(this,"malformed memory page size");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              *puStack_28 = 1 << ((byte)local_68 & 0x1f);
            }
            *(byte *)(out_page_size_local + 4) = local_45 & 1;
            *(byte *)((long)out_page_size_local + 0x11) = local_46 & 1;
            *(byte *)((long)out_page_size_local + 0x12) = local_47 & 1;
            *(uint64_t *)out_page_size_local = max;
            *(ulong *)(out_page_size_local + 2) = _has_custom_page_size;
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"custom page sizes not allowed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"memory64 not allowed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"memory may not be shared: threads not allowed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"malformed memory limits flag: %d",(ulong)initial._7_1_);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits,
                                uint32_t* out_page_size) {
  uint8_t flags;
  uint64_t initial;
  uint64_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  bool has_custom_page_size =
      flags & WABT_BINARY_LIMITS_HAS_CUSTOM_PAGE_SIZE_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_MEMORY_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  ERROR_IF(
      has_custom_page_size && !options_.features.custom_page_sizes_enabled(),
      "custom page sizes not allowed");
  if (options_.features.memory64_enabled()) {
    CHECK_RESULT(ReadU64Leb128(&initial, "memory initial page count"));
    if (has_max) {
      CHECK_RESULT(ReadU64Leb128(&max, "memory max page count"));
    }
  } else {
    uint32_t initial32;
    CHECK_RESULT(ReadU32Leb128(&initial32, "memory initial page count"));
    initial = initial32;
    if (has_max) {
      uint32_t max32;
      CHECK_RESULT(ReadU32Leb128(&max32, "memory max page count"));
      max = max32;
    }
  }
  if (has_custom_page_size) {
    uint32_t page_size_log2;
    CHECK_RESULT(ReadU32Leb128(&page_size_log2, "memory page size"));
    ERROR_IF(page_size_log2 > 16, "malformed memory page size");
    *out_page_size = 1 << page_size_log2;
  } else {
    *out_page_size = WABT_DEFAULT_PAGE_SIZE;
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  return Result::Ok;
}